

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SamplingMode * __thiscall
CoreML::Specification::ResizeBilinearLayerParams::mutable_mode(ResizeBilinearLayerParams *this)

{
  SamplingMode *this_00;
  
  this_00 = this->mode_;
  if (this_00 == (SamplingMode *)0x0) {
    this_00 = (SamplingMode *)operator_new(0x18);
    SamplingMode::SamplingMode(this_00);
    this->mode_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SamplingMode* ResizeBilinearLayerParams::mutable_mode() {
  
  if (mode_ == NULL) {
    mode_ = new ::CoreML::Specification::SamplingMode;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ResizeBilinearLayerParams.mode)
  return mode_;
}